

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Call.h
# Opt level: O2

ptr<Value> __thiscall Call::evaluate(Call *this,Environment *env)

{
  undefined8 *puVar1;
  ThrowPacket *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar2;
  ptr<Value> pVar3;
  ptr<Callable> callable;
  ValueList values;
  shared_ptr<Value> local_60;
  undefined1 local_50 [16];
  ptr<Value> value;
  
  (*(code *)**(undefined8 **)(env->symbols)._M_h._M_bucket_count)(&value);
  std::dynamic_pointer_cast<Callable,Value>((shared_ptr<Value> *)&callable);
  if (callable.super___shared_ptr<Callable,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    values.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    values.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    values.super__Vector_base<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar1 = *(undefined8 **)&(env->symbols)._M_h._M_rehash_policy;
    for (puVar2 = (undefined8 *)(env->symbols)._M_h._M_element_count; puVar2 != puVar1;
        puVar2 = puVar2 + 2) {
      (*(code *)**(undefined8 **)*puVar2)(&local_60);
      std::vector<std::shared_ptr<Value>,std::allocator<std::shared_ptr<Value>>>::
      emplace_back<std::shared_ptr<Value>>
                ((vector<std::shared_ptr<Value>,std::allocator<std::shared_ptr<Value>>> *)&values,
                 &local_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_60.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    (*(callable.super___shared_ptr<Callable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Callable[1])
              (this,callable.super___shared_ptr<Callable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&values
              );
    std::vector<std::shared_ptr<Value>,_std::allocator<std::shared_ptr<Value>_>_>::~vector(&values);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&callable.super___shared_ptr<Callable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (ptr<Value>)pVar3.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"Value not callable",(allocator<char> *)&local_60);
  ExceptionObjects::call_failed((string *)local_50);
  ThrowPacket::ThrowPacket(this_00,(ptr<Value> *)local_50);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);
        ptr<Callable> callable = std::dynamic_pointer_cast<Callable>(value);

        if(!callable)
            throw ThrowPacket(ExceptionObjects::call_failed("Value not callable"));

        ValueList values;
        for(auto& expr : expressionList)
            values.push_back(expr -> evaluate(env));

        return callable->call(values);
    }